

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

Rollup * bloaty::Rollup::GetEmpty(void)

{
  if (empty_ == (Rollup *)0x0) {
    empty_ = (Rollup *)operator_new(0x60);
    empty_->vm_total_ = 0;
    empty_->file_total_ = 0;
    empty_->filtered_vm_total_ = 0;
    empty_->filtered_file_total_ = 0;
    empty_->filter_regex_ = (ReImpl *)0x0;
    (empty_->children_)._M_h._M_buckets = &(empty_->children_)._M_h._M_single_bucket;
    (empty_->children_)._M_h._M_bucket_count = 1;
    (empty_->children_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (empty_->children_)._M_h._M_element_count = 0;
    (empty_->children_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (empty_->children_)._M_h._M_rehash_policy._M_next_resize = 0;
    (empty_->children_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  }
  return empty_;
}

Assistant:

static Rollup* GetEmpty() {
    if (!empty_) {
      empty_ = new Rollup();
    }
    return empty_;
  }